

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

string * __thiscall TCLAP::Arg::longID(string *__return_storage_ptr__,Arg *this,string *valueId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","");
  iVar3 = std::__cxx11::string::compare((char *)&this->_flag);
  local_38 = paVar1;
  if (iVar3 != 0) {
    paVar1 = &local_98.field_2;
    local_98.field_2._M_allocated_capacity._0_2_ = 0x2d;
    local_98._M_string_length = 1;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::operator+(&local_b8,&local_98,&this->_flag);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p)
    ;
    paVar2 = &local_b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (this->_valueRequired == true) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct((ulong)local_58,'\x01');
      plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
      local_78 = &local_68;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar4[3];
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_78,(ulong)(valueId->_M_dataplus)._M_p);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_98.field_2._M_allocated_capacity = *psVar6;
        local_98.field_2._8_8_ = plVar4[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar6;
        local_98._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_98._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b8.field_2._M_allocated_capacity = *psVar6;
        local_b8.field_2._8_8_ = plVar4[3];
        local_b8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar6;
        local_b8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_b8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  paVar1 = &local_98.field_2;
  local_98._M_string_length = 2;
  local_98.field_2._M_allocated_capacity._0_3_ = 0x2d2d;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::operator+(&local_b8,&local_98,&this->_name);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
  paVar2 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (this->_valueRequired == true) {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,'\x01');
    plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar4;
    }
    local_70 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)(valueId->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_98.field_2._M_allocated_capacity = *psVar6;
      local_98.field_2._8_8_ = plVar4[3];
      local_98._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar6;
      local_98._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_98._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8.field_2._8_8_ = plVar4[3];
      local_b8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::longID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
	{
		id += Arg::flagStartString() + _flag;

		if ( _valueRequired )
			id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

		id += ", ";
	}

	id += Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

	return id;

}